

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 02.cpp
# Opt level: O1

int main(void)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  int x;
  char eme [8];
  int local_1c;
  char local_18 [8];
  
  setlocale(6,anon_var_dwarf_91a + 0x3b);
  builtin_strncpy(local_18,"\x1b[1;33m",8);
  sVar1 = strlen(local_18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_18,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_8d8,0x3b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_8ee,0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::istream::operator>>((istream *)&std::cin,&local_1c);
  if (local_1c == 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_904,0x27);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    pcVar3 = anon_var_dwarf_91a;
    lVar2 = 0x3b;
  }
  else {
    pcVar3 = anon_var_dwarf_924;
    lVar2 = 0x2e;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
    setlocale(LC_ALL, "");
    char eme[] = {0x1b, '[', '1', ';', '3', '3', 'm', 0};
    cout << eme;

    int x;

    cout << "Você acredita que é capaz de amar o destino que escolheu?" << endl;
    cout << "Digite 1 para sim e 0 para não." << endl;
    cin >> x;

    if (x == 1)
    {
        cout << "Friedrich Nietzsche concorda com você." << endl;
        cout << "Para uma reafirmação disso, leia 'Além do bem e do mal'." << endl;
    }
    else
    {
        cout << "Seria bom começar a viver os pre-socráticos." << endl;
    }

    return 0;
}